

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.h
# Opt level: O0

BasicTypeInfo<std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>_> *
dap::TypeInfo::
create<dap::BasicTypeInfo<std::vector<dap::StackFrame,std::allocator<dap::StackFrame>>>,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  BasicTypeInfo<std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>_> *this;
  BasicTypeInfo<std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>_> *typeinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  this = (BasicTypeInfo<std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>_> *)
         operator_new(0x28);
  BasicTypeInfo<std::vector<dap::StackFrame,_std::allocator<dap::StackFrame>_>_>::BasicTypeInfo
            (this,args);
  deleteOnExit((TypeInfo *)this);
  return this;
}

Assistant:

static T* create(ARGS&&... args) {
    auto typeinfo = new T(std::forward<ARGS>(args)...);
    deleteOnExit(typeinfo);
    return typeinfo;
  }